

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O0

qint64 __thiscall QFileDevice::readData(QFileDevice *this,char *data,qint64 len)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QFileDevicePrivate *pQVar4;
  pointer pQVar5;
  int extraout_var;
  long in_RDX;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  FileError err;
  qint64 read;
  QFileDevicePrivate *d;
  QFileDevicePrivate *in_stack_ffffffffffffff88;
  FileError err_00;
  QAbstractFileEngine *in_stack_ffffffffffffff90;
  QFileDevicePrivate *this_00;
  undefined4 in_stack_ffffffffffffff98;
  FileError local_54;
  long local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QFileDevice *)0x198134);
  if (in_RDX == 0) {
    local_28 = 0;
  }
  else {
    unsetError((QFileDevice *)in_stack_ffffffffffffff90);
    bVar2 = QFileDevicePrivate::ensureFlushed(in_stack_ffffffffffffff88);
    err_00 = (FileError)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    if (bVar2) {
      pQVar5 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
               operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                           *)0x198186);
      iVar3 = (*pQVar5->_vptr_QAbstractFileEngine[0x23])(pQVar5,in_RSI,in_RDX);
      local_28 = CONCAT44(extraout_var,iVar3);
      if (extraout_var < 0) {
        std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
                  ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                   0x1981ba);
        local_54 = QAbstractFileEngine::error(in_stack_ffffffffffffff90);
        if (local_54 == UnspecifiedError) {
          local_54 = ReadError;
        }
        this_00 = pQVar4;
        std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
                  ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                   0x1981f8);
        QAbstractFileEngine::errorString
                  ((QAbstractFileEngine *)CONCAT44(local_54,in_stack_ffffffffffffff98));
        QFileDevicePrivate::setError(this_00,err_00,(QString *)0x198218);
        QString::~QString((QString *)0x198222);
      }
      if (local_28 < in_RDX) {
        pQVar4->cachedSize = 0;
      }
    }
    else {
      local_28 = -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

qint64 QFileDevice::readData(char *data, qint64 len)
{
    Q_D(QFileDevice);
    if (!len)
        return 0;
    unsetError();
    if (!d->ensureFlushed())
        return -1;

    const qint64 read = d->fileEngine->read(data, len);
    if (read < 0) {
        QFileDevice::FileError err = d->fileEngine->error();
        if (err == QFileDevice::UnspecifiedError)
            err = QFileDevice::ReadError;
        d->setError(err, d->fileEngine->errorString());
    }

    if (read < len) {
        // failed to read all requested, may be at the end of file, stop caching size so that it's rechecked
        d->cachedSize = 0;
    }

    return read;
}